

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# locmap.cpp
# Opt level: O2

uint32_t uprv_convertToLCID_63(char *langID,char *posixID,UErrorCode *status)

{
  uint32_t uVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  uint32_t uVar5;
  uint32_t uVar6;
  size_t sVar7;
  uint uVar8;
  long lVar9;
  uint uVar10;
  uint uVar11;
  UErrorCode myStatus;
  UErrorCode *local_38;
  
  uVar6 = 0;
  if (((posixID != (char *)0x0 && langID != (char *)0x0) && (sVar7 = strlen(langID), 1 < sVar7)) &&
     (sVar7 = strlen(posixID), uVar6 = 0, 1 < sVar7)) {
    uVar10 = 0;
    uVar3 = 0;
    local_38 = status;
    uVar2 = 0x8d;
    while ((uVar8 = uVar2, uVar10 < uVar8 && (uVar11 = uVar8 + uVar10 >> 1, uVar11 != uVar3))) {
      iVar4 = strcmp(langID,(gPosixIDmap[uVar11].regionMaps)->posixID);
      uVar3 = uVar11;
      uVar2 = uVar11;
      if ((-1 < iVar4) && (uVar10 = uVar11, uVar2 = uVar8, iVar4 == 0)) {
        uVar6 = getHostID(gPosixIDmap + uVar11,posixID,local_38);
        return uVar6;
      }
    }
    uVar6 = 0xffffffff;
    for (lVar9 = 0; lVar9 != 0x8d0; lVar9 = lVar9 + 0x10) {
      myStatus = U_ZERO_ERROR;
      uVar5 = getHostID((ILcidPosixMap *)((long)&gPosixIDmap[0].numRegions + lVar9),posixID,
                        &myStatus);
      uVar1 = uVar5;
      if ((myStatus != U_ERROR_WARNING_START) && (uVar1 = uVar6, myStatus == U_ZERO_ERROR)) {
        return uVar5;
      }
      uVar6 = uVar1;
    }
    if (uVar6 == 0xffffffff) {
      *local_38 = U_ILLEGAL_ARGUMENT_ERROR;
      uVar6 = 0;
    }
    else {
      *local_38 = U_ERROR_WARNING_START;
    }
  }
  return uVar6;
}

Assistant:

U_CAPI uint32_t
uprv_convertToLCID(const char *langID, const char* posixID, UErrorCode* status)
{
    // This function does the table lookup when native platform name->lcid conversion isn't available,
    // or for locales that don't follow patterns the platform expects.
    uint32_t   low    = 0;
    uint32_t   high   = gLocaleCount;
    uint32_t   mid;
    uint32_t   oldmid = 0;
    int32_t    compVal;

    uint32_t   value         = 0;
    uint32_t   fallbackValue = (uint32_t)-1;
    UErrorCode myStatus;
    uint32_t   idx;

    /* Check for incomplete id. */
    if (!langID || !posixID || uprv_strlen(langID) < 2 || uprv_strlen(posixID) < 2) {
        return 0;
    }

    /*Binary search for the map entry for normal cases */

    while (high > low)  /*binary search*/{

        mid = (high+low) >> 1; /*Finds median*/

        if (mid == oldmid) 
            break;

        compVal = uprv_strcmp(langID, gPosixIDmap[mid].regionMaps->posixID);
        if (compVal < 0){
            high = mid;
        }
        else if (compVal > 0){
            low = mid;
        }
        else /*we found it*/{
            return getHostID(&gPosixIDmap[mid], posixID, status);
        }
        oldmid = mid;
    }

    /*
     * Sometimes we can't do a binary search on posixID because some LCIDs
     * go to different locales.  We hit one of those special cases.
     */
    for (idx = 0; idx < gLocaleCount; idx++ ) {
        myStatus = U_ZERO_ERROR;
        value = getHostID(&gPosixIDmap[idx], posixID, &myStatus);
        if (myStatus == U_ZERO_ERROR) {
            return value;
        }
        else if (myStatus == U_USING_FALLBACK_WARNING) {
            fallbackValue = value;
        }
    }

    if (fallbackValue != (uint32_t)-1) {
        *status = U_USING_FALLBACK_WARNING;
        return fallbackValue;
    }

    /* no match found */
    *status = U_ILLEGAL_ARGUMENT_ERROR;
    return 0;   /* return international (root) */
}